

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter_p.h
# Opt level: O2

void __thiscall QTextMarkdownWriter::~QTextMarkdownWriter(QTextMarkdownWriter *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_codeBlockFence).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_linePrefix).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_listInfo).d);
  return;
}

Assistant:

class Q_GUI_EXPORT QTextMarkdownWriter
{
public:
    QTextMarkdownWriter(QTextStream &stream, QTextDocument::MarkdownFeatures features);
    bool writeAll(const QTextDocument *document);
#if QT_CONFIG(itemmodel)
    void writeTable(const QAbstractItemModel *table);
#endif

    int writeBlock(const QTextBlock &block, bool table, bool ignoreFormat, bool ignoreEmpty);
    void writeFrame(const QTextFrame *frame);
    void writeFrontMatter(const QString &fm);

private:
    struct ListInfo {
        bool loose;
    };

    ListInfo listInfo(QTextList *list);
    void setLinePrefixForBlockQuote(int level);

private:
    QTextStream &m_stream;
    QTextDocument::MarkdownFeatures m_features;
    QMap<QTextList *, ListInfo> m_listInfo;
    QString m_linePrefix;
    QString m_codeBlockFence;
    int m_wrappedLineIndent = 0;
    int m_lastListIndent = 1;
    bool m_doubleNewlineWritten = false;
    bool m_linePrefixWritten = false;
    bool m_indentedCodeBlock = false;
    bool m_fencedCodeBlock = false;
}